

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall
QGraphicsScenePrivate::dispatchHoverEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneHoverEvent *hoverEvent)

{
  bool bVar1;
  const_iterator o;
  QGraphicsScenePrivate *pQVar2;
  QGraphicsItem *pQVar3;
  qsizetype qVar4;
  QGraphicsScenePrivate *pQVar5;
  QGraphicsItem **ppQVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *parent_1;
  QGraphicsItem *parent;
  QGraphicsItem *lastItem;
  int i;
  int index;
  QGraphicsItem *tmp;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QGraphicsItem *item;
  const_reverse_iterator end;
  const_reverse_iterator it;
  QList<QGraphicsItem_*> parents;
  QGraphicsItem *commonAncestorItem;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  QGraphicsItem *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar7;
  int local_108;
  QGraphicsItem *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar8;
  QGraphicsScenePrivate *in_stack_ffffffffffffff10;
  Type type;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QPoint *in_stack_ffffffffffffff30;
  QGraphicsScenePrivate *in_stack_ffffffffffffff38;
  int local_b8;
  QGraphicsScenePrivate *local_a0;
  bool local_81;
  QGraphicsScenePrivate *local_58;
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)&in_RDI[4].field_0x18 >> 0xc & 1) == 0) {
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9ce968);
    if (bVar1) {
      local_28 = QGraphicsSceneHoverEvent::screenPos
                           ((QGraphicsSceneHoverEvent *)
                            CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      local_38 = QGraphicsSceneHoverEvent::scenePos
                           ((QGraphicsSceneHoverEvent *)in_stack_fffffffffffffee8);
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9ce9b2);
      itemsAtPosition(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                      (QPointF *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_RDI);
      QList<QGraphicsItem_*>::operator=
                ((QList<QGraphicsItem_*> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QList<QGraphicsItem_*> *)in_stack_fffffffffffffed8);
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ce9fd);
    }
    local_a0 = (QGraphicsScenePrivate *)0x0;
    local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<QGraphicsItem_*>::begin
                         ((QList<QGraphicsItem_*> *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    o = QList<QGraphicsItem_*>::end
                  ((QList<QGraphicsItem_*> *)
                   CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_40,o),
          pQVar2 = local_a0, bVar1) {
      ppQVar6 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_40);
      pQVar2 = (QGraphicsScenePrivate *)*ppQVar6;
      bVar1 = itemAcceptsHoverEvents_helper
                        ((QGraphicsScenePrivate *)
                         CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      if (bVar1) break;
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_40);
    }
    local_a0 = pQVar2;
    if ((local_a0 == (QGraphicsScenePrivate *)0x0) ||
       (bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9ceb07), bVar1)) {
      pQVar2 = (QGraphicsScenePrivate *)0x0;
      local_58 = pQVar2;
    }
    else {
      in_stack_ffffffffffffff10 = local_a0;
      QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed8);
      pQVar2 = (QGraphicsScenePrivate *)
               QGraphicsItem::commonAncestorItem
                         ((QGraphicsItem *)
                          CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                          in_stack_ffffffffffffff00);
      local_58 = pQVar2;
    }
    while( true ) {
      bVar8 = 0;
      if (local_58 != (QGraphicsScenePrivate *)0x0) {
        bVar1 = itemAcceptsHoverEvents_helper
                          ((QGraphicsScenePrivate *)
                           CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
        bVar8 = bVar1 ^ 0xff;
      }
      if ((bVar8 & 1) == 0) break;
      local_58 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)0x9ceb93);
    }
    if (local_58 != (QGraphicsScenePrivate *)0x0) {
      in_stack_ffffffffffffff00 = QGraphicsItem::panel(in_stack_fffffffffffffee8);
      pQVar3 = QGraphicsItem::panel(in_stack_fffffffffffffee8);
      if (in_stack_ffffffffffffff00 != pQVar3) {
        local_58 = (QGraphicsScenePrivate *)0x0;
      }
    }
    if (local_58 == (QGraphicsScenePrivate *)0x0) {
      local_108 = -1;
    }
    else {
      qVar4 = QListSpecialMethodsBase<QGraphicsItem*>::indexOf<QGraphicsItem*>
                        ((QListSpecialMethodsBase<QGraphicsItem_*> *)
                         CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                         (QGraphicsItem **)in_stack_fffffffffffffed8,0x9cec08);
      local_108 = (int)qVar4;
    }
    qVar4 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&in_RDI[0xe].super_QPaintDevice);
    local_b8 = (int)qVar4;
    while (local_b8 = local_b8 + -1, local_108 < local_b8) {
      QList<QGraphicsItem_*>::takeLast
                ((QList<QGraphicsItem_*> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      bVar1 = itemAcceptsHoverEvents_helper
                        ((QGraphicsScenePrivate *)
                         CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      if (bVar1) {
        sendHoverEvent(pQVar2,(Type)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (QGraphicsItem *)CONCAT17(bVar8,in_stack_ffffffffffffff08),
                       (QGraphicsSceneHoverEvent *)in_stack_ffffffffffffff00);
      }
    }
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9cecd9);
    pQVar5 = local_a0;
    while (uVar7 = pQVar5 != (QGraphicsScenePrivate *)0x0 && pQVar5 != local_58,
          pQVar5 != (QGraphicsScenePrivate *)0x0 && pQVar5 != local_58) {
      QList<QGraphicsItem_*>::append((QList<QGraphicsItem_*> *)0x9ced24,in_stack_fffffffffffffed8);
      bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9ced2e);
      if (bVar1) break;
      pQVar5 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)0x9ced40);
    }
    QList<QGraphicsItem_*>::crbegin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffee8);
    QList<QGraphicsItem_*>::crend((QList<QGraphicsItem_*> *)in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = std::operator!=((reverse_iterator<QList<QGraphicsItem_*>::const_iterator> *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                              (reverse_iterator<QList<QGraphicsItem_*>::const_iterator> *)
                              in_stack_fffffffffffffed8);
      type = (Type)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      if (!bVar1) break;
      std::reverse_iterator<QList<QGraphicsItem_*>::const_iterator>::operator*
                ((reverse_iterator<QList<QGraphicsItem_*>::const_iterator> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      QList<QGraphicsItem_*>::operator<<
                ((QList<QGraphicsItem_*> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      bVar1 = itemAcceptsHoverEvents_helper
                        ((QGraphicsScenePrivate *)CONCAT17(uVar7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      if (bVar1) {
        sendHoverEvent(pQVar2,(Type)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (QGraphicsItem *)CONCAT17(bVar8,in_stack_ffffffffffffff08),
                       (QGraphicsSceneHoverEvent *)in_stack_ffffffffffffff00);
      }
      std::reverse_iterator<QList<QGraphicsItem_*>::const_iterator>::operator++
                ((reverse_iterator<QList<QGraphicsItem_*>::const_iterator> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    if (((local_a0 == (QGraphicsScenePrivate *)0x0) ||
        (bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9cee36), bVar1)) ||
       (ppQVar6 = QList<QGraphicsItem_*>::constLast
                            ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed8),
       local_a0 != (QGraphicsScenePrivate *)*ppQVar6)) {
      local_81 = false;
    }
    else {
      sendHoverEvent(pQVar2,type,(QGraphicsItem *)CONCAT17(bVar8,in_stack_ffffffffffffff08),
                     (QGraphicsSceneHoverEvent *)in_stack_ffffffffffffff00);
      local_81 = true;
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ceeb3);
  }
  else {
    local_81 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_81;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScenePrivate::dispatchHoverEvent(QGraphicsSceneHoverEvent *hoverEvent)
{
    if (allItemsIgnoreHoverEvents)
        return false;

    // Find the first item that accepts hover events, reusing earlier
    // calculated data is possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(hoverEvent->screenPos(),
                                                hoverEvent->scenePos(),
                                                hoverEvent->widget());
    }

    QGraphicsItem *item = nullptr;
    for (auto tmp : std::as_const(cachedItemsUnderMouse)) {
        if (itemAcceptsHoverEvents_helper(tmp)) {
            item = tmp;
            break;
        }
    }

    // Find the common ancestor item for the new topmost hoverItem and the
    // last item in the hoverItem list.
    QGraphicsItem *commonAncestorItem = (item && !hoverItems.isEmpty()) ? item->commonAncestorItem(hoverItems.constLast()) : nullptr;
    while (commonAncestorItem && !itemAcceptsHoverEvents_helper(commonAncestorItem))
        commonAncestorItem = commonAncestorItem->parentItem();
    if (commonAncestorItem && commonAncestorItem->panel() != item->panel()) {
        // The common ancestor isn't in the same panel as the two hovered
        // items.
        commonAncestorItem = nullptr;
    }

    // Check if the common ancestor item is known.
    int index = commonAncestorItem ? hoverItems.indexOf(commonAncestorItem) : -1;
    // Send hover leaves to any existing hovered children of the common
    // ancestor item.
    for (int i = hoverItems.size() - 1; i > index; --i) {
        QGraphicsItem *lastItem = hoverItems.takeLast();
        if (itemAcceptsHoverEvents_helper(lastItem))
            sendHoverEvent(QEvent::GraphicsSceneHoverLeave, lastItem, hoverEvent);
    }

    // Item is a child of a known item. Generate enter events for the
    // missing links.
    QList<QGraphicsItem *> parents;
    QGraphicsItem *parent = item;
    while (parent && parent != commonAncestorItem) {
        parents.append(parent);
        if (parent->isPanel()) {
            // Stop at the panel - we don't deliver beyond this point.
            break;
        }
        parent = parent->parentItem();
    }
    for (auto it = parents.crbegin(), end = parents.crend(); it != end; ++it) {
        QGraphicsItem *parent = *it;
        hoverItems << parent;
        if (itemAcceptsHoverEvents_helper(parent))
            sendHoverEvent(QEvent::GraphicsSceneHoverEnter, parent, hoverEvent);
    }

    // Generate a move event for the item itself
    if (item
        && !hoverItems.isEmpty()
        && item == hoverItems.constLast()) {
        sendHoverEvent(QEvent::GraphicsSceneHoverMove, item, hoverEvent);
        return true;
    }
    return false;
}